

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cc
# Opt level: O1

size_t absl::lts_20250127::strings_internal::EncodeUTF8Char(char *buffer,char32_t utf8_char)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  
  if ((uint)utf8_char < 0x80) {
    sVar2 = 1;
  }
  else {
    bVar1 = (byte)utf8_char & 0x3f | 0x80;
    if ((uint)utf8_char < 0x800) {
      buffer[1] = bVar1;
      utf8_char = (char32_t)(byte)((byte)((uint)utf8_char >> 6) | 0xc0);
      sVar2 = 2;
    }
    else {
      bVar4 = (byte)((uint)utf8_char >> 6) & 0x3f | 0x80;
      bVar3 = (byte)((uint)utf8_char >> 0xc);
      if ((uint)utf8_char < 0x10000) {
        buffer[2] = bVar1;
        buffer[1] = bVar4;
        sVar2 = 3;
        utf8_char = (char32_t)(bVar3 | 0xe0);
      }
      else {
        buffer[3] = bVar1;
        buffer[2] = bVar4;
        buffer[1] = bVar3 & 0x3f | 0x80;
        utf8_char = (char32_t)(byte)((byte)((uint)utf8_char >> 0x12) | 0xf0);
        sVar2 = 4;
      }
    }
  }
  *buffer = (char)utf8_char;
  return sVar2;
}

Assistant:

size_t EncodeUTF8Char(char *buffer, char32_t utf8_char) {
  if (utf8_char <= 0x7F) {
    *buffer = static_cast<char>(utf8_char);
    return 1;
  } else if (utf8_char <= 0x7FF) {
    buffer[1] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[0] = static_cast<char>(0xC0 | utf8_char);
    return 2;
  } else if (utf8_char <= 0xFFFF) {
    buffer[2] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[1] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[0] = static_cast<char>(0xE0 | utf8_char);
    return 3;
  } else {
    buffer[3] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[2] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[1] = static_cast<char>(0x80 | (utf8_char & 0x3F));
    utf8_char >>= 6;
    buffer[0] = static_cast<char>(0xF0 | utf8_char);
    return 4;
  }
}